

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O1

void * xmlCatalogAddLocal(void *catalogs,xmlChar *URL)

{
  xmlGenericErrorFunc p_Var1;
  long *plVar2;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  xmlCatalogEntryPtr pxVar5;
  long *plVar6;
  xmlCatalogEntryPtr pxVar7;
  
  if (xmlCatalogInitialized == '\0') {
    xmlInitializeCatalog();
  }
  pxVar7 = (xmlCatalogEntryPtr)catalogs;
  if (URL != (xmlChar *)0x0) {
    if (xmlDebugCatalogs != 0) {
      pp_Var3 = __xmlGenericError();
      p_Var1 = *pp_Var3;
      ppvVar4 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar4,"Adding document catalog %s\n",URL);
    }
    pxVar5 = xmlNewCatalogEntry(XML_CATA_CATALOG,(xmlChar *)0x0,URL,(xmlChar *)0x0,
                                xmlCatalogDefaultPrefer,(xmlCatalogEntryPtr)0x0);
    if ((pxVar5 != (xmlCatalogEntryPtr)0x0) &&
       (plVar2 = (long *)catalogs, pxVar7 = pxVar5, catalogs != (void *)0x0)) {
      do {
        plVar6 = plVar2;
        plVar2 = (long *)*plVar6;
      } while (plVar2 != (long *)0x0);
      *plVar6 = (long)pxVar5;
      pxVar7 = (xmlCatalogEntryPtr)catalogs;
    }
  }
  return pxVar7;
}

Assistant:

void *
xmlCatalogAddLocal(void *catalogs, const xmlChar *URL) {
    xmlCatalogEntryPtr catal, add;

    if (!xmlCatalogInitialized)
	xmlInitializeCatalog();

    if (URL == NULL)
	return(catalogs);

    if (xmlDebugCatalogs)
	xmlGenericError(xmlGenericErrorContext,
		"Adding document catalog %s\n", URL);

    add = xmlNewCatalogEntry(XML_CATA_CATALOG, NULL, URL, NULL,
	                     xmlCatalogDefaultPrefer, NULL);
    if (add == NULL)
	return(catalogs);

    catal = (xmlCatalogEntryPtr) catalogs;
    if (catal == NULL)
	return((void *) add);

    while (catal->next != NULL)
	catal = catal->next;
    catal->next = add;
    return(catalogs);
}